

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O2

void __thiscall
MemoryLeakDetector::markCheckingPeriodLeaksAsNonCheckingPeriod(MemoryLeakDetector *this)

{
  MemoryLeakDetectorNode *leak;
  
  for (leak = MemoryLeakDetectorTable::getFirstLeak(&this->memoryTable_,mem_leak_period_checking);
      leak != (MemoryLeakDetectorNode *)0x0;
      leak = MemoryLeakDetectorTable::getNextLeak(&this->memoryTable_,leak,mem_leak_period_checking)
      ) {
    if (*(int *)(leak + 0x30) == 3) {
      *(undefined4 *)(leak + 0x30) = 2;
    }
  }
  return;
}

Assistant:

void MemoryLeakDetector::markCheckingPeriodLeaksAsNonCheckingPeriod()
{
    MemoryLeakDetectorNode* leak = memoryTable_.getFirstLeak(mem_leak_period_checking);
    while (leak) {
        if (leak->period_ == mem_leak_period_checking) leak->period_ = mem_leak_period_enabled;
        leak = memoryTable_.getNextLeak(leak, mem_leak_period_checking);
    }
}